

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_prepare_handshake_record(mbedtls_ssl_context *ssl)

{
  ulong uVar1;
  byte *pbVar2;
  mbedtls_ssl_handshake_params *pmVar3;
  int *piVar4;
  bool bVar5;
  uchar *puVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  ushort uVar11;
  ulong uVar12;
  int unaff_EBP;
  byte bVar13;
  byte bVar14;
  char *pcVar15;
  ulong uVar16;
  uint uVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  size_t sVar21;
  uchar *puVar22;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 uVar23;
  undefined4 uVar26;
  ulong uVar24;
  size_t sVar25;
  uint local_48;
  
  uVar12 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8 + 4;
  if (ssl->in_msglen < uVar12) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0xc06,"handshake message too short: %d");
    return -0x7200;
  }
  pbVar2 = ssl->in_msg;
  uVar12 = ((ulong)pbVar2[3] | (ulong)((uint)pbVar2[2] << 8 | (uint)pbVar2[1] << 0x10)) + uVar12;
  ssl->in_hslen = uVar12;
  uVar23 = CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(uint)*pbVar2);
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xc11,"handshake message: msglen = %d, type = %d, hslen = %d",ssl->in_msglen,uVar23,
             uVar12);
  if ((ssl->conf->field_0x174 & 2) == 0) {
    if (ssl->in_hslen <= ssl->in_msglen) {
      return 0;
    }
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0xc4f,"TLS handshake fragmentation not supported");
    return -0x7080;
  }
  pmVar3 = ssl->handshake;
  puVar6 = ssl->in_msg;
  if (pmVar3 == (mbedtls_ssl_handshake_params *)0x0) {
LAB_00113f7e:
    if ((((ssl->in_hslen <= ssl->in_msglen) && (puVar6[8] == '\0' && *(short *)(puVar6 + 6) == 0))
        && (puVar6[0xb] == puVar6[3] && *(short *)(puVar6 + 9) == *(short *)(puVar6 + 1))) &&
       ((bVar5 = true, pmVar3 == (mbedtls_ssl_handshake_params *)0x0 ||
        (pmVar3->hs_msg == (uchar *)0x0)))) goto LAB_00114327;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0xc41,"found fragmented DTLS handshake message");
    if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
      pcVar15 = "not supported outside handshake (for now)";
      iVar8 = 0xb75;
LAB_0011409b:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,iVar8,pcVar15);
      unaff_EBP = -0x7080;
    }
    else {
      sVar21 = ssl->in_hslen;
      uVar16 = sVar21 - 0xc;
      piVar4 = (int *)ssl->handshake->hs_msg;
      if (piVar4 == (int *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0xb81,"initialize reassembly, total length = %d",uVar16,uVar23,uVar12);
        if (ssl->in_hslen < 0x4001) {
          sVar9 = ((uVar16 >> 3) + sVar21 + 1) - (ulong)((uVar16 & 7) == 0);
          puVar6 = (uchar *)calloc(1,sVar9);
          pmVar3 = ssl->handshake;
          pmVar3->hs_msg = puVar6;
          if (puVar6 == (uchar *)0x0) {
            bVar5 = false;
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0xb8f,"alloc failed (%d bytes)",sVar9,uVar23,uVar12);
            unaff_EBP = -0x7f00;
          }
          else {
            puVar22 = ssl->in_msg;
            *(undefined2 *)(puVar6 + 4) = *(undefined2 *)(puVar22 + 4);
            *(undefined4 *)puVar6 = *(undefined4 *)puVar22;
            puVar6 = pmVar3->hs_msg;
            puVar6[8] = '\0';
            puVar6[6] = '\0';
            puVar6[7] = '\0';
            puVar6 = ssl->handshake->hs_msg;
            puVar6[0xb] = puVar6[3];
            *(undefined2 *)(puVar6 + 9) = *(undefined2 *)(puVar6 + 1);
            bVar5 = true;
          }
        }
        else {
          bVar5 = false;
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                     ,0xb85,"handshake message too large");
          unaff_EBP = -0x7080;
        }
        if (!bVar5) goto LAB_001142f8;
LAB_00114245:
        puVar6 = ssl->in_msg;
        bVar18 = puVar6[8];
        uVar20 = (ulong)((uint)puVar6[7] << 8 | (uint)puVar6[6] << 0x10) | (ulong)bVar18;
        uVar19 = (uint)puVar6[10] << 8 | (uint)puVar6[9] << 0x10;
        bVar13 = puVar6[0xb];
        sVar9 = (ulong)uVar19 + (ulong)bVar13;
        if (uVar16 < sVar9 + uVar20) {
          pcVar15 = "invalid fragment offset/len: %d + %d > %d";
          iVar8 = 0xbb4;
          uVar24 = sVar9;
          uVar12 = uVar16;
        }
        else {
          uVar1 = sVar9 + 0xc;
          uVar24 = ssl->in_msglen;
          if (uVar1 <= uVar24) {
            puVar6 = ssl->handshake->hs_msg;
            sVar25 = sVar9;
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0xbc0,"adding fragment, offset = %d, length = %d",uVar20,sVar9,uVar12);
            memcpy(puVar6 + uVar20 + 0xc,ssl->in_msg + 0xc,sVar9);
            bVar18 = bVar18 & 7;
            if (bVar18 == 0) {
LAB_00114439:
              if ((sVar9 & 7) != 0) {
                uVar12 = uVar20 + sVar9 >> 3;
                bVar18 = puVar6[uVar12 + sVar21];
                iVar8 = 8 - ((uint)sVar9 & 7);
                do {
                  bVar18 = bVar18 | (byte)(1 << ((byte)iVar8 & 0x1f));
                  iVar8 = iVar8 + 1;
                } while (iVar8 != 8);
                puVar6[uVar12 + sVar21] = bVar18;
              }
              memset(puVar6 + (uVar20 >> 3) + sVar21,0xff,sVar9 >> 3);
            }
            else {
              bVar18 = 8 - bVar18;
              uVar12 = uVar20 >> 3;
              uVar17 = (uint)sVar9;
              uVar7 = (uint)bVar18;
              if (uVar17 < bVar18 || uVar17 == uVar7) {
                if (sVar9 != 0) {
                  bVar14 = puVar6[uVar12 + sVar21];
                  local_48 = (uint)bVar13;
                  iVar8 = uVar7 - (uVar19 + local_48);
                  do {
                    bVar14 = bVar14 | (byte)(1 << ((byte)iVar8 & 0x1f));
                    iVar8 = iVar8 + 1;
                    sVar9 = sVar9 - 1;
                  } while (sVar9 != 0);
                  puVar6[uVar12 + sVar21] = bVar14;
                }
                sVar9 = 0;
              }
              else {
                bVar13 = puVar6[uVar12 + sVar21];
                do {
                  uVar7 = uVar7 - 1;
                  bVar13 = bVar13 | (byte)(1 << ((byte)uVar7 & 0x1f));
                } while (uVar7 != 0);
                uVar20 = uVar20 + bVar18;
                sVar9 = sVar9 - bVar18;
                puVar6[uVar12 + sVar21] = bVar13;
              }
              if (bVar18 < uVar17) goto LAB_00114439;
            }
            uVar12 = uVar16 >> 3;
            if (7 < uVar16) {
              uVar20 = 0;
              do {
                if (puVar6[uVar20 + sVar21] != 0xff) goto LAB_0011451e;
                uVar20 = uVar20 + 1;
              } while (uVar12 != uVar20);
            }
            uVar20 = uVar16 & 7;
            uVar16 = uVar20;
            if (uVar20 != 0) {
              uVar16 = -uVar20;
              lVar10 = 0;
              do {
                if ((puVar6[uVar12 + sVar21] >> ((int)lVar10 + 7U & 0x1f) & 1) == 0)
                goto LAB_0011451e;
                lVar10 = lVar10 + -1;
              } while (-lVar10 != uVar20);
            }
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0xbcf,"handshake message completed",uVar16,sVar25);
            if (ssl->in_msglen <= uVar1) {
              uVar12 = ssl->next_record_offset;
              sVar9 = ssl->in_left - uVar12;
              if (uVar12 <= ssl->in_left && sVar9 != 0) {
                puVar6 = ssl->in_hdr;
                sVar21 = (long)(ssl->in_msg + ssl->in_hslen) - (long)puVar6;
                ssl->next_record_offset = sVar21;
                puVar22 = (uchar *)(sVar21 + sVar9);
                ssl->in_left = (size_t)puVar22;
                if (ssl->in_buf + (0x414d - (long)puVar6) < puVar22) {
                  mbedtls_debug_print_msg
                            (ssl,1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                             ,0xbee,"reassembled message too large for buffer");
                  unaff_EBP = -0x6a00;
                  goto LAB_001142f8;
                }
                memmove(ssl->in_msg + ssl->in_hslen,puVar6 + uVar12,sVar9);
              }
              memcpy(ssl->in_msg,ssl->handshake->hs_msg,ssl->in_hslen);
              free(ssl->handshake->hs_msg);
              ssl->handshake->hs_msg = (uchar *)0x0;
              mbedtls_debug_print_buf
                        (ssl,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                         ,0xbfb,"reassembled handshake message",ssl->in_msg,ssl->in_hslen);
              unaff_EBP = 0;
              goto LAB_001142f8;
            }
            pcVar15 = "last fragment not alone in its record";
            iVar8 = 0xbd8;
            goto LAB_0011409b;
          }
          pcVar15 = "invalid fragment length: %d + 12 > %d";
          iVar8 = 0xbbb;
          uVar20 = sVar9;
        }
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,iVar8,pcVar15,uVar20,uVar24,uVar12);
      }
      else {
        if (*piVar4 == *(int *)ssl->in_msg) goto LAB_00114245;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0xb9f,"fragment header mismatch",uVar16,uVar23,uVar12);
      }
      unaff_EBP = -0x7200;
    }
    goto LAB_001142f8;
  }
  uVar11 = *(ushort *)(puVar6 + 4) << 8 | *(ushort *)(puVar6 + 4) >> 8;
  if ((uint)uVar11 == pmVar3->in_msg_seq) goto LAB_00113f7e;
  uVar26 = (undefined4)((ulong)uVar23 >> 0x20);
  if (((uint)uVar11 != pmVar3->in_flight_start_seq - 1) || (*puVar6 == '\x03')) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0xc33,"dropping out-of-sequence message: message_seq = %d, expected = %d",
               (ulong)uVar11,CONCAT44(uVar26,pmVar3->in_msg_seq),uVar12);
LAB_00114076:
    bVar5 = false;
    unaff_EBP = -0x6900;
    goto LAB_00114327;
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xc26,"received message from last flight, message_seq = %d, start_of_flight = %d",
             (ulong)uVar11,CONCAT44(uVar26,pmVar3->in_flight_start_seq),uVar12);
  unaff_EBP = mbedtls_ssl_resend(ssl);
  if (unaff_EBP == 0) goto LAB_00114076;
  pcVar15 = "mbedtls_ssl_resend";
  iVar8 = 0xc2a;
LAB_00114317:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,iVar8,pcVar15,unaff_EBP);
  bVar5 = false;
LAB_00114327:
  if (bVar5) {
    return 0;
  }
  return unaff_EBP;
LAB_0011451e:
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xbcb,"message is not complete yet",uVar16,sVar25);
  unaff_EBP = -0x6900;
LAB_001142f8:
  if (unaff_EBP == 0) {
    bVar5 = true;
    goto LAB_00114327;
  }
  pcVar15 = "ssl_reassemble_dtls_handshake";
  iVar8 = 0xc45;
  goto LAB_00114317;
}

Assistant:

int mbedtls_ssl_prepare_handshake_record( mbedtls_ssl_context *ssl )
{
    if( ssl->in_msglen < mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "handshake message too short: %d",
                            ssl->in_msglen ) );
        return( MBEDTLS_ERR_SSL_INVALID_RECORD );
    }

    ssl->in_hslen = mbedtls_ssl_hs_hdr_len( ssl ) + (
                    ( ssl->in_msg[1] << 16 ) |
                    ( ssl->in_msg[2] << 8  ) |
                      ssl->in_msg[3] );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "handshake message: msglen ="
                        " %d, type = %d, hslen = %d",
                        ssl->in_msglen, ssl->in_msg[0], ssl->in_hslen ) );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        int ret;
        unsigned int recv_msg_seq = ( ssl->in_msg[4] << 8 ) | ssl->in_msg[5];

        /* ssl->handshake is NULL when receiving ClientHello for renego */
        if( ssl->handshake != NULL &&
            recv_msg_seq != ssl->handshake->in_msg_seq )
        {
            /* Retransmit only on last message from previous flight, to avoid
             * too many retransmissions.
             * Besides, No sane server ever retransmits HelloVerifyRequest */
            if( recv_msg_seq == ssl->handshake->in_flight_start_seq - 1 &&
                ssl->in_msg[0] != MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST )
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "received message from last flight, "
                                    "message_seq = %d, start_of_flight = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_flight_start_seq ) );

                if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
                {
                    MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_resend", ret );
                    return( ret );
                }
            }
            else
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "dropping out-of-sequence message: "
                                    "message_seq = %d, expected = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_msg_seq ) );
            }

            return( MBEDTLS_ERR_SSL_WANT_READ );
        }
        /* Wait until message completion to increment in_msg_seq */

        /* Reassemble if current message is fragmented or reassembly is
         * already in progress */
        if( ssl->in_msglen < ssl->in_hslen ||
            memcmp( ssl->in_msg + 6, "\0\0\0",        3 ) != 0 ||
            memcmp( ssl->in_msg + 9, ssl->in_msg + 1, 3 ) != 0 ||
            ( ssl->handshake != NULL && ssl->handshake->hs_msg != NULL ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "found fragmented DTLS handshake message" ) );

            if( ( ret = ssl_reassemble_dtls_handshake( ssl ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_reassemble_dtls_handshake", ret );
                return( ret );
            }
        }
    }
    else
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    /* With TLS we don't handle fragmentation (for now) */
    if( ssl->in_msglen < ssl->in_hslen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "TLS handshake fragmentation not supported" ) );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    return( 0 );
}